

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

void SetLoopParams(VP8Encoder *enc,float q)

{
  int iVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  VP8MBInfo *pVVar6;
  WebPAuxStats *pWVar7;
  uint8_t uVar8;
  int iVar9;
  long lVar10;
  uint8_t uVar11;
  uint uVar12;
  ulong uVar13;
  int total;
  uint8_t uVar14;
  int total_1;
  int iVar15;
  float fVar16;
  int p [4];
  undefined8 local_28;
  undefined8 uStack_20;
  
  fVar16 = 100.0;
  if (q <= 100.0) {
    fVar16 = q;
  }
  VP8SetSegmentParams(enc,(float)(~-(uint)(q < 0.0) & (uint)fVar16));
  local_28 = 0;
  uStack_20 = 0;
  uVar12 = enc->mb_h_ * enc->mb_w_;
  if (0 < (int)uVar12) {
    pVVar6 = enc->mb_info_;
    uVar13 = 0;
    do {
      piVar2 = (int *)((long)&local_28 + (ulong)(*(byte *)(pVVar6 + uVar13) >> 3 & 0xc));
      *piVar2 = *piVar2 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  pWVar7 = enc->pic_->stats;
  if (pWVar7 != (WebPAuxStats *)0x0) {
    *(undefined8 *)pWVar7->segment_size = local_28;
    *(undefined8 *)(pWVar7->segment_size + 2) = uStack_20;
  }
  if ((enc->segment_hdr_).num_segments_ < 2) {
    (enc->segment_hdr_).update_map_ = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = local_28._4_4_ + (int)local_28;
    iVar1 = uStack_20._4_4_ + (int)uStack_20;
    uVar11 = 0xff;
    uVar14 = 0xff;
    iVar15 = iVar1 + iVar9;
    if (iVar15 != 0) {
      uVar14 = (uint8_t)((iVar15 / 2 + iVar9 * 0xff) / iVar15);
    }
    (enc->proba_).segments_[0] = uVar14;
    if (iVar9 != 0) {
      uVar11 = (uint8_t)((iVar9 / 2 + (int)local_28 * 0xff) / iVar9);
    }
    (enc->proba_).segments_[1] = uVar11;
    if (iVar1 == 0) {
      uVar8 = 0xff;
    }
    else {
      uVar8 = (uint8_t)((iVar1 / 2 + (int)uStack_20 * 0xff) / iVar1);
    }
    (enc->proba_).segments_[2] = uVar8;
    if ((uVar14 == 0xff) && (uVar11 == 0xff)) {
      (enc->segment_hdr_).update_map_ = (uint)(uVar8 != 0xff);
      if ((uVar8 == 0xff) && (0 < enc->mb_h_ * enc->mb_w_)) {
        lVar10 = 0;
        do {
          *(byte *)(enc->mb_info_ + lVar10) = *(byte *)(enc->mb_info_ + lVar10) & 0x9f;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)enc->mb_h_ * (long)enc->mb_w_);
      }
    }
    else {
      (enc->segment_hdr_).update_map_ = 1;
    }
    bVar3 = (enc->proba_).segments_[0];
    bVar4 = (enc->proba_).segments_[1];
    bVar5 = (enc->proba_).segments_[2];
    iVar9 = ((uint)VP8EntropyCost[bVar5 ^ 0xff] + (uint)VP8EntropyCost[bVar3 ^ 0xff]) *
            uStack_20._4_4_ +
            ((uint)VP8EntropyCost[bVar5] + (uint)VP8EntropyCost[bVar3 ^ 0xff]) * (int)uStack_20 +
            ((uint)VP8EntropyCost[bVar4 ^ 0xff] + (uint)VP8EntropyCost[bVar3]) * local_28._4_4_ +
            ((uint)VP8EntropyCost[bVar4] + (uint)VP8EntropyCost[bVar3]) * (int)local_28;
  }
  (enc->segment_hdr_).size_ = iVar9;
  VP8CalculateLevelCosts(&enc->proba_);
  (enc->proba_).nb_skip_ = 0;
  enc->sse_count_ = 0;
  enc->sse_[0] = 0;
  enc->sse_[1] = 0;
  enc->sse_[2] = 0;
  return;
}

Assistant:

static void SetLoopParams(VP8Encoder* const enc, float q) {
  // Make sure the quality parameter is inside valid bounds
  q = Clamp(q, 0.f, 100.f);

  VP8SetSegmentParams(enc, q);      // setup segment quantizations and filters
  SetSegmentProbas(enc);            // compute segment probabilities

  ResetStats(enc);
  ResetSSE(enc);
}